

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fix_func_call_arguments.cpp
# Opt level: O3

Status __thiscall spvtools::opt::FixFuncCallArgumentsPass::Process(FixFuncCallArgumentsPass *this)

{
  Module *pMVar1;
  pointer puVar2;
  Status SVar3;
  pointer puVar4;
  bool modified;
  byte local_51;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_51 = 0;
  pMVar1 = (((this->super_Pass).context_)->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  puVar4 = *(pointer *)
            &(pMVar1->functions_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
             ._M_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->functions_).
                    super__Vector_base<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>,_std::allocator<std::unique_ptr<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>_>_>
            + 8);
  SVar3 = SuccessWithoutChange;
  if ((long)puVar2 - (long)puVar4 != 8 && puVar2 != puVar4) {
    do {
      local_50._8_8_ = &local_51;
      local_38 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_func_call_arguments.cpp:31:22)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/fix_func_call_arguments.cpp:31:22)>
                 ::_M_manager;
      local_50._M_unused._M_object = this;
      opt::Function::ForEachInst
                ((Function *)
                 (puVar4->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Function,_std::default_delete<spvtools::opt::Function>_>
                 ,(function<void_(spvtools::opt::Instruction_*)> *)&local_50,false,false);
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,__destroy_functor);
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar2);
    SVar3 = local_51 & 1 ^ SuccessWithoutChange;
  }
  return SVar3;
}

Assistant:

Pass::Status FixFuncCallArgumentsPass::Process() {
  bool modified = false;
  if (ModuleHasASingleFunction()) return Status::SuccessWithoutChange;
  for (auto& func : *get_module()) {
    func.ForEachInst([this, &modified](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        modified |= FixFuncCallArguments(inst);
      }
    });
  }
  return modified ? Status::SuccessWithChange : Status::SuccessWithoutChange;
}